

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int hash_iter_keys(HashTable *table,void **_key,void **iter)

{
  HashItem *pHVar1;
  uint32 uVar2;
  ulong uVar3;
  bool bVar4;
  HashItem *orig;
  HashItem *pHStack_30;
  uint32 idx;
  HashItem *item;
  void **iter_local;
  void **_key_local;
  HashTable *table_local;
  
  pHVar1 = (HashItem *)*iter;
  orig._4_4_ = 0;
  pHStack_30 = pHVar1;
  if ((pHVar1 != (HashItem *)0x0) && (pHStack_30 = pHVar1->next, pHStack_30 == (HashItem *)0x0)) {
    uVar2 = calc_hash(table,pHVar1->key);
    orig._4_4_ = uVar2 + 1;
  }
  while( true ) {
    bVar4 = false;
    if (pHStack_30 == (HashItem *)0x0) {
      bVar4 = orig._4_4_ < table->table_len;
    }
    if (!bVar4) break;
    uVar3 = (ulong)orig._4_4_;
    orig._4_4_ = orig._4_4_ + 1;
    pHStack_30 = table->table[uVar3];
  }
  if (pHStack_30 != (HashItem *)0x0) {
    *_key = pHStack_30->key;
    *iter = pHStack_30;
  }
  else {
    *_key = (void *)0x0;
    *iter = (void *)0x0;
  }
  table_local._4_4_ = (uint)(pHStack_30 != (HashItem *)0x0);
  return table_local._4_4_;
}

Assistant:

int hash_iter_keys(const HashTable *table, const void **_key, void **iter)
{
    HashItem *item = (HashItem *) *iter;
    uint32 idx = 0;

    if (item != NULL)
    {
        const HashItem *orig = item;
        item = item->next;
        if (item == NULL)
            idx = calc_hash(table, orig->key) + 1;
    } // if

    while (!item && (idx < table->table_len))
        item = table->table[idx++];  // skip empty buckets...

    if (item == NULL)  // no more matches?
    {
        *_key = NULL;
        *iter = NULL;
        return 0;
    } // if

    *_key = item->key;
    *iter = item;
    return 1;
}